

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen10CachePolicy.cpp
# Opt level: O1

GMM_STATUS __thiscall GmmLib::GmmGen10CachePolicy::SetPATInitWA(GmmGen10CachePolicy *this)

{
  return GMM_ERROR;
}

Assistant:

GMM_STATUS GmmLib::GmmGen10CachePolicy::SetPATInitWA()
{
    GMM_STATUS Status = GMM_SUCCESS;

#if(defined(__GMM_KMD__))
    if(pGmmLibContext->GetGtSysInfoPtr()->EdramSizeInKb)
    {
        const_cast<WA_TABLE &>(pGmmLibContext->GetWaTable()).WaNoMocsEllcOnly = 1;
    }
#else
    Status = GMM_ERROR;
#endif

    return Status;
}